

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void getCompatibleInterfaceProperties
               (cmGeneratorTarget *target,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ifaceProperties,string *config)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmComputeLinkInformation *this;
  cmLocalGenerator *this_00;
  ostream *poVar4;
  string *psVar5;
  ItemVector *this_01;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  reference local_200;
  Item *dep;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  ItemVector *deps;
  ostringstream local_1a8 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  cmComputeLinkInformation *info;
  string *config_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ifaceProperties_local;
  cmGeneratorTarget *target_local;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 != OBJECT_LIBRARY) {
    this = cmGeneratorTarget::GetLinkInformation(target,config);
    if (this == (cmComputeLinkInformation *)0x0) {
      this_00 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,"Exporting the target \"");
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"\" is not allowed since its linker language cannot be determined");
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,(string *)&deps);
      std::__cxx11::string::~string((string *)&deps);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    else {
      this_01 = cmComputeLinkInformation::GetItems(this);
      __end1 = std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::begin(this_01);
      dep = (Item *)std::
                    vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                    ::end(this_01);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                         *)&dep), bVar2) {
        local_200 = __gnu_cxx::
                    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                    ::operator*(&__end1);
        if (local_200->Target != (cmGeneratorTarget *)0x0) {
          pcVar1 = local_200->Target;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"COMPATIBLE_INTERFACE_BOOL",&local_221);
          getPropertyContents(pcVar1,&local_220,ifaceProperties);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          pcVar1 = local_200->Target;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"COMPATIBLE_INTERFACE_STRING",&local_249);
          getPropertyContents(pcVar1,&local_248,ifaceProperties);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          pcVar1 = local_200->Target;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_271);
          getPropertyContents(pcVar1,&local_270,ifaceProperties);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          pcVar1 = local_200->Target;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_299);
          getPropertyContents(pcVar1,&local_298,ifaceProperties);
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator(&local_299);
        }
        __gnu_cxx::
        __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
        ::operator++(&__end1);
      }
    }
  }
  return;
}

Assistant:

static void getCompatibleInterfaceProperties(
  cmGeneratorTarget const* target, std::set<std::string>& ifaceProperties,
  const std::string& config)
{
  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // object libraries have no link information, so nothing to compute
    return;
  }

  cmComputeLinkInformation* info = target->GetLinkInformation(config);

  if (!info) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Exporting the target \"" << target->GetName()
      << "\" is not "
         "allowed since its linker language cannot be determined";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  const cmComputeLinkInformation::ItemVector& deps = info->GetItems();

  for (auto const& dep : deps) {
    if (!dep.Target) {
      continue;
    }
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_BOOL",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_STRING",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                        ifaceProperties);
  }
}